

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O3

Var Js::JavascriptExceptionOperators::StackTraceAccessor
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ThreadContext *pTVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  HRESULT HVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  Var pvVar9;
  RecyclableObject *obj;
  CompoundString *this;
  Type *this_00;
  FunctionBody *pFVar10;
  ScriptContext *pSVar11;
  LPCWSTR pWVar12;
  List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  void *__frameAddr;
  int in_stack_00000010;
  undefined1 local_c8 [8];
  LeaveScriptObject<true,_false,_false> __leaveScriptObject;
  Var cache;
  CallInfo callInfo_local;
  ArgumentReader args;
  List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *local_78;
  StackTrace *stackTrace;
  LPCWSTR functionName;
  LONG local_60;
  ULONG lineNumber;
  LONG characterPosition;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  CompoundString *local_48;
  
  cache = (Var)callInfo;
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x60e,"(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                       "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00a975b7;
    *puVar8 = 0;
  }
  callInfo_local = callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,(CallInfo *)&cache);
  if (((ulong)callInfo_local & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x60f,"(args.Info.Count > 0)","Should always have implicit \'this\'");
    if (!bVar3) goto LAB_00a975b7;
    *puVar8 = 0;
  }
  _characterPosition =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  if (_characterPosition == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x613,"(scriptContext)","scriptContext");
    if (!bVar3) goto LAB_00a975b7;
    *puVar8 = 0;
  }
  pSVar11 = _characterPosition;
  pvVar9 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  bVar3 = VarIs<Js::RecyclableObject>(pvVar9);
  if (bVar3) {
    pvVar9 = Arguments::operator[]((Arguments *)&callInfo_local,0);
    obj = VarTo<Js::RecyclableObject>(pvVar9);
    pSVar11 = _characterPosition;
    if (((ulong)callInfo_local & 0xfffffe) == 0) {
      __leaveScriptObject.__exceptionCheck.handledExceptionType = ExceptionType_None;
      __leaveScriptObject._36_4_ = 0;
      iVar4 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x14])
                        (obj,obj,6,&__leaveScriptObject.__exceptionCheck,0,_characterPosition);
      this = (CompoundString *)__leaveScriptObject._32_8_;
      if (iVar4 == 0 || __leaveScriptObject._32_8_ == 0) {
        this = (CompoundString *)
               JavascriptLibrary::GetEmptyString
                         ((pSVar11->super_ScriptContextBase).javascriptLibrary);
        AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                  ((AutoNestedHandledExceptionType *)&lineNumber,
                   ExceptionType_JavascriptException|ExceptionType_StackOverflow|
                   ExceptionType_OutOfMemory);
        local_78 = (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    *)0x0;
        iVar4 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x14])(obj,obj,5,&local_78,0,pSVar11);
        if ((iVar4 == 0) ||
           (local_78 ==
            (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)0x0)) {
          (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
            [0x19])(obj,6,this,0,0);
          AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                    ((AutoNestedHandledExceptionType *)&lineNumber);
        }
        else {
          bVar3 = IsErrorInstance(obj);
          local_48 = this;
          if (bVar3) {
            local_48 = (CompoundString *)JavascriptConversion::ToString(obj,pSVar11);
          }
          this = CompoundString::NewWithCharCapacity
                           (0x28,(pSVar11->super_ScriptContextBase).javascriptLibrary);
          CompoundString::AppendChars(this,(JavascriptString *)local_48);
          this_01 = local_78;
          if (0 < (local_78->
                  super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
                  ).count) {
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            iVar4 = 0;
            do {
              this_00 = JsUtil::
                        List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        ::Item(this_01,iVar4);
              bVar3 = JavascriptExceptionContext::StackFrame::IsScriptFunction(this_00);
              if (bVar3) {
                pFVar10 = JavascriptExceptionContext::StackFrame::GetFunctionBody(this_00);
                pSVar11 = FunctionProxy::GetScriptContext((FunctionProxy *)pFVar10);
                if (pSVar11 == (ScriptContext *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar8 = 1;
                  bVar3 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                                     ,0x64e,"(funcScriptContext)","funcScriptContext");
                  if (!bVar3) goto LAB_00a975b7;
                  *puVar8 = 0;
                }
                if ((_characterPosition == pSVar11) ||
                   (iVar5 = (*_characterPosition->hostScriptContext->_vptr_HostScriptContext[8])
                                      (_characterPosition->hostScriptContext,pSVar11), -1 < iVar5))
                goto LAB_00a97293;
              }
              else {
LAB_00a97293:
                pFVar10 = JavascriptExceptionContext::StackFrame::GetFunctionBody(this_00);
                if ((pFVar10 == (FunctionBody *)0x0) ||
                   ((((pFVar10->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.
                     ptr)->field_0xa8 & 4) != 0)) {
                  pWVar12 = JavascriptExceptionContext::StackFrame::GetFunctionName(this_00);
                  AppendLibraryFrameToStackTrace(this,pWVar12);
                }
                else {
                  functionName._4_4_ = 0;
                  local_60 = 0;
                  FunctionBody::GetLineCharOffset
                            (pFVar10,(this_00->field_1).byteCodeOffset,
                             (ULONG *)((long)&functionName + 4),&local_60,true);
                  pWVar12 = ParseableFunctionInfo::GetSourceName
                                      (&pFVar10->super_ParseableFunctionInfo);
                  pSVar11 = _characterPosition;
                  stackTrace = (StackTrace *)0x0;
                  if (DAT_015bc475 == '\x01') {
                    LeaveScriptObject<true,_false,_false>::LeaveScriptObject
                              ((LeaveScriptObject<true,_false,_false> *)local_c8,_characterPosition,
                               &stack0xfffffffffffffff8);
                    pTVar1 = pSVar11->threadContext;
                    bVar3 = pTVar1->reentrancySafeOrHandled;
                    pTVar1->reentrancySafeOrHandled = true;
                    HVar6 = JavascriptExceptionContext::StackFrame::GetFunctionNameWithArguments
                                      (this_00,(LPCWSTR *)&stackTrace);
                    if (HVar6 != 0) {
                      stackTrace = (StackTrace *)
                                   ParseableFunctionInfo::GetExternalDisplayName
                                             (&pFVar10->super_ParseableFunctionInfo);
                    }
                    ThreadContext::DisposeOnLeaveScript(_characterPosition->threadContext);
                    pTVar1->reentrancySafeOrHandled = bVar3;
                    LeaveScriptObject<true,_false,_false>::~LeaveScriptObject
                              ((LeaveScriptObject<true,_false,_false> *)local_c8);
                  }
                  else {
                    stackTrace = (StackTrace *)
                                 ParseableFunctionInfo::GetExternalDisplayName
                                           (&pFVar10->super_ParseableFunctionInfo);
                  }
                  if (pWVar12 == (LPCWSTR)0x0) {
                    pWVar12 = L"";
                  }
                  AppendExternalFrameToStackTrace
                            (this,(LPCWSTR)stackTrace,pWVar12,functionName._4_4_ + 1,local_60 + 1);
                }
              }
              iVar4 = iVar4 + 1;
              this_01 = local_78;
            } while (iVar4 < (local_78->
                             super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
                             ).count);
          }
          BVar7 = JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext();
          if (BVar7 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar8 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                               ,0x67c,
                               "(JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext())",
                               "JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext()");
            if (!bVar3) {
LAB_00a975b7:
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar8 = 0;
          }
          AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                    ((AutoNestedHandledExceptionType *)&lineNumber);
          (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
            [0x19])(obj,6,this,0,0);
        }
      }
    }
    else {
      pvVar9 = Arguments::operator[]((Arguments *)&callInfo_local,1);
      (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
        [0x19])(obj,6,pvVar9,0,0);
      bVar3 = VarIs<Js::JavascriptError,Js::RecyclableObject>(obj);
      if (bVar3) {
        *(undefined1 *)((long)&obj[2].type.ptr + 4) = 1;
      }
      this = (CompoundString *)
             JavascriptLibrary::GetEmptyString
                       ((_characterPosition->super_ScriptContextBase).javascriptLibrary);
    }
  }
  else {
    this = (CompoundString *)
           (((pSVar11->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
           undefinedValue.ptr;
  }
  return this;
}

Assistant:

Var JavascriptExceptionOperators::StackTraceAccessor(RecyclableObject* function, CallInfo callInfo, ...)
    {
        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        ScriptContext *scriptContext = function->GetScriptContext();

        AnalysisAssert(scriptContext);

        // If the first argument to the accessor is not a recyclable object, return undefined
        // for compat with other browsers
        if (!VarIs<RecyclableObject>(args[0]))
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }

        RecyclableObject *obj = VarTo<RecyclableObject>(args[0]);

        // If an argument was passed to the accessor, it is being called as a setter.
        // Set the internal StackTraceCache property accordingly.
        if (args.Info.Count > 1)
        {
            obj->SetInternalProperty(InternalPropertyIds::StackTraceCache, args[1], PropertyOperationFlags::PropertyOperation_None, NULL);
            if (VarIs<JavascriptError>(obj))
            {
                ((JavascriptError *)obj)->SetStackPropertyRedefined(true);
            }
            return scriptContext->GetLibrary()->GetEmptyString();
        }

        // Otherwise, the accessor is being called as a getter.
        // Return existing cached value, or obtain the string representation of the StackTrace to return.
        Var cache = NULL;
        if (obj->GetInternalProperty(obj,InternalPropertyIds::StackTraceCache, (Var*)&cache, NULL, scriptContext) && cache)
        {
            return cache;
        }

        JavascriptString* stringMessage = scriptContext->GetLibrary()->GetEmptyString();
        HRESULT hr;
        BEGIN_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NESTED
        {
            Js::JavascriptExceptionContext::StackTrace *stackTrace = NULL;
            if (!obj->GetInternalProperty(obj,InternalPropertyIds::StackTrace, (Js::Var*) &stackTrace, NULL, scriptContext) ||
                stackTrace == nullptr)
            {
                obj->SetInternalProperty(InternalPropertyIds::StackTraceCache, stringMessage, PropertyOperationFlags::PropertyOperation_None, NULL);
                return stringMessage;
            }

            if (IsErrorInstance(obj))
            {
                stringMessage = JavascriptConversion::ToString(obj, scriptContext);
            }

            CompoundString *const stringBuilder = CompoundString::NewWithCharCapacity(40, scriptContext->GetLibrary());
            stringBuilder->AppendChars(stringMessage);

            for (int i = 0; i < stackTrace->Count(); i++)
            {
                Js::JavascriptExceptionContext::StackFrame& currentFrame = stackTrace->Item(i);

                // Defend in depth. Discard cross domain frames if somehow they creped in.
                if (currentFrame.IsScriptFunction())
                {
                    ScriptContext* funcScriptContext = currentFrame.GetFunctionBody()->GetScriptContext();
                    AnalysisAssert(funcScriptContext);
                    if (scriptContext != funcScriptContext && FAILED(scriptContext->GetHostScriptContext()->CheckCrossDomainScriptContext(funcScriptContext)))
                    {
                        continue; // Ignore this frame
                    }
                }

                FunctionBody* functionBody = currentFrame.GetFunctionBody();
                const bool isLibraryCode = !functionBody || functionBody->GetUtf8SourceInfo()->GetIsLibraryCode();
                if (isLibraryCode)
                {
                    AppendLibraryFrameToStackTrace(stringBuilder, currentFrame.GetFunctionName());
                }
                else
                {
                    LPCWSTR pUrl = NULL;
                    ULONG lineNumber = 0;
                    LONG characterPosition = 0;

                    functionBody->GetLineCharOffset(currentFrame.GetByteCodeOffset(), &lineNumber, &characterPosition);
                    pUrl = functionBody->GetSourceName();
                    LPCWSTR functionName = nullptr;
                    if (CONFIG_FLAG(ExtendedErrorStackForTestHost))
                    {
                        BEGIN_LEAVE_SCRIPT_INTERNAL(scriptContext)
                        {
                            if (currentFrame.GetFunctionNameWithArguments(&functionName) != S_OK)
                            {
                                functionName = functionBody->GetExternalDisplayName();
                            }
                        }
                        END_LEAVE_SCRIPT_INTERNAL(scriptContext)
                    }
                    else
                    {
                        functionName = functionBody->GetExternalDisplayName();
                    }
                    AppendExternalFrameToStackTrace(stringBuilder, functionName, pUrl ? pUrl : _u(""), lineNumber + 1, characterPosition + 1);
                }
            }

            // Try to create the string object even if we did OOM, but if can't, just return what we've got. We catch and ignore OOM so it doesn't propagate up.
            // With all the stack trace functionality, we do best effort to produce the stack trace in the case of OOM, but don't want it to trigger an OOM. Idea is if do take
            // an OOM, have some chance of producing a stack trace to see where it happened.
            stringMessage = stringBuilder;
        }